

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O3

PField * __thiscall PClass::AddField(PClass *this,FName *name,PType *type,DWORD flags)

{
  uint uVar1;
  PField *pPVar2;
  BYTE *pBVar3;
  FName local_24;
  
  uVar1 = *(uint *)((long)&(this->super_PNativeStruct).super_PStruct.super_PNamedType.
                           super_PCompoundType.super_PType.super_PTypeBase.super_DObject + 0x24);
  pPVar2 = PStruct::AddField((PStruct *)this,&local_24,type,flags);
  if (((char)((flags & 8) >> 3) == '\0' && pPVar2 != (PField *)0x0) &&
     (this->Defaults != (BYTE *)0x0)) {
    pBVar3 = (BYTE *)M_Realloc_Dbg(this->Defaults,
                                   (ulong)*(uint *)((long)&(this->super_PNativeStruct).super_PStruct
                                                           .super_PNamedType.super_PCompoundType.
                                                           super_PType.super_PTypeBase.super_DObject
                                                   + 0x24),
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobjtype.cpp"
                                   ,0xd24);
    this->Defaults = pBVar3;
    memset(pBVar3 + uVar1,0,
           (ulong)(*(int *)((long)&(this->super_PNativeStruct).super_PStruct.super_PNamedType.
                                   super_PCompoundType.super_PType.super_PTypeBase.super_DObject +
                           0x24) - uVar1));
  }
  return pPVar2;
}

Assistant:

PField *PClass::AddField(FName name, PType *type, DWORD flags)
{
	unsigned oldsize = Size;
	PField *field = Super::AddField(name, type, flags);

	// Only initialize the defaults if they have already been created.
	// For ZScript this is not the case, it will first define all fields before
	// setting up any defaults for any class.
	if (field != nullptr && !(flags & VARF_Native) && Defaults != nullptr)
	{
		Defaults = (BYTE *)M_Realloc(Defaults, Size);
		memset(Defaults + oldsize, 0, Size - oldsize);
	}
	return field;
}